

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::remap_hlsl_resource_binding
          (CompilerHLSL *this,HLSLBindingFlagBits type,uint32_t *desc_set,uint32_t *binding)

{
  iterator iVar1;
  long lVar2;
  long lVar3;
  key_type local_2c;
  
  local_2c.model = Compiler::get_execution_model((Compiler *)this);
  local_2c.desc_set = *desc_set;
  local_2c.binding = *binding;
  iVar1 = ::std::
          _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->resource_bindings)._M_h,&local_2c);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    *(undefined1 *)
     ((long)iVar1.
            super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
            ._M_cur + 0x40) = 1;
    if ((int)type < 8) {
      if (type - HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT < 2) {
        lVar2 = 0x24;
        lVar3 = 0x20;
      }
      else {
        if (type != HLSL_BINDING_AUTO_SRV_BIT) {
          return;
        }
        lVar2 = 0x34;
        lVar3 = 0x30;
      }
    }
    else if (type == HLSL_BINDING_AUTO_UAV_BIT) {
      lVar2 = 0x2c;
      lVar3 = 0x28;
    }
    else {
      if (type != HLSL_BINDING_AUTO_SAMPLER_BIT) {
        return;
      }
      lVar2 = 0x3c;
      lVar3 = 0x38;
    }
    *desc_set = *(uint32_t *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
                        ._M_cur + lVar3);
    *binding = *(uint32_t *)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
                       ._M_cur + lVar2);
  }
  return;
}

Assistant:

void CompilerHLSL::remap_hlsl_resource_binding(HLSLBindingFlagBits type, uint32_t &desc_set, uint32_t &binding)
{
	auto itr = resource_bindings.find({ get_execution_model(), desc_set, binding });
	if (itr != end(resource_bindings))
	{
		auto &remap = itr->second;
		remap.second = true;

		switch (type)
		{
		case HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT:
		case HLSL_BINDING_AUTO_CBV_BIT:
			desc_set = remap.first.cbv.register_space;
			binding = remap.first.cbv.register_binding;
			break;

		case HLSL_BINDING_AUTO_SRV_BIT:
			desc_set = remap.first.srv.register_space;
			binding = remap.first.srv.register_binding;
			break;

		case HLSL_BINDING_AUTO_SAMPLER_BIT:
			desc_set = remap.first.sampler.register_space;
			binding = remap.first.sampler.register_binding;
			break;

		case HLSL_BINDING_AUTO_UAV_BIT:
			desc_set = remap.first.uav.register_space;
			binding = remap.first.uav.register_binding;
			break;

		default:
			break;
		}
	}
}